

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

int lj_cparse(CPState *cp)

{
  int iVar1;
  undefined1 local_218 [4];
  int errcode;
  CTState savects_;
  CPState *cp_local;
  
  savects_.hash._248_8_ = cp;
  memcpy(local_218,cp->cts,0x208);
  iVar1 = lj_vm_cpcall(*(undefined8 *)(savects_.hash._248_8_ + 0x48),0,savects_.hash._248_8_,
                       cpcparser);
  if (iVar1 != 0) {
    *(undefined4 *)(*(long *)(savects_.hash._248_8_ + 0x50) + 8) = savects_.tab._0_4_;
    memcpy((void *)(*(long *)(savects_.hash._248_8_ + 0x50) + 0x108),&savects_.cb.slot,0x100);
  }
  cp_cleanup((CPState *)savects_.hash._248_8_);
  return iVar1;
}

Assistant:

int lj_cparse(CPState *cp)
{
  LJ_CTYPE_SAVE(cp->cts);
  int errcode = lj_vm_cpcall(cp->L, NULL, cp, cpcparser);
  if (errcode)
    LJ_CTYPE_RESTORE(cp->cts);
  cp_cleanup(cp);
  return errcode;
}